

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::SubmitRenderPass::logPrepare
          (SubmitRenderPass *this,TestLog *log,size_t commandIndex)

{
  pointer ppRVar1;
  RenderPassCommand *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t cmdNdx;
  ulong uVar4;
  ScopedLogSection section;
  string sectionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  string local_38;
  
  local_40 = commandIndex;
  de::toString<unsigned_long>(&local_38,&local_40);
  std::operator+(&local_80,&local_38,":");
  iVar3 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
  std::operator+(&local_60,&local_80,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_38);
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_80,log,&local_60,&local_60);
  uVar4 = 0;
  while( true ) {
    ppRVar1 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_commands).
                      super__Vector_base<vkt::memory::(anonymous_namespace)::RenderPassCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::RenderPassCommand_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar4)
    break;
    pRVar2 = ppRVar1[uVar4];
    (*pRVar2->_vptr_RenderPassCommand[3])(pRVar2,log,uVar4);
    uVar4 = uVar4 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void SubmitRenderPass::logPrepare (TestLog& log, size_t commandIndex) const
{
	const string				sectionName	(de::toString(commandIndex) + ":" + getName());
	const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		RenderPassCommand& command = *m_commands[cmdNdx];
		command.logPrepare(log, cmdNdx);
	}
}